

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl_Still::commitParameters(Private_Impl_Still *this)

{
  char *pcVar1;
  MMAL_PORT_T *port;
  MMAL_STATUS_T MVar2;
  size_t sVar3;
  MMAL_FOURCC_T MVar4;
  MMAL_PARAMETER_COLOURFX_T colfx;
  MMAL_PARAMETER_INPUT_CROP_T crop;
  MMAL_PARAMETER_HEADER_T local_40;
  undefined8 local_38;
  undefined4 local_30;
  MMAL_PARAMETER_HEADER_T local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  if (this->changedSettings == true) {
    commitSharpness(this);
    commitContrast(this);
    mmal_port_parameter_set_rational
              (this->camera->control,0x1002e,
               (MMAL_RATIONAL_T)((ulong)this->brightness | 0x6400000000));
    if (this->encoder_output_port != (MMAL_PORT_T *)0x0) {
      mmal_port_parameter_set_uint32(this->encoder_output_port,0x10019,this->quality);
    }
    commitSaturation(this);
    commitISO(this);
    commitExposure(this);
    commitMetering(this);
    commitAWB(this);
    commitImageEffect(this);
    commitRotation(this);
    commitFlips(this);
    MVar2 = mmal_port_parameter_set_boolean(this->camera->control,0x1001d,0);
    if (MVar2 != MMAL_SUCCESS) {
      pcVar1 = this->API_NAME;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,": Failed to set video stabilization parameter.\n",0x2f);
    }
    MVar2 = mmal_port_parameter_set_int32(this->camera->control,0x1000d,0);
    if (MVar2 != MMAL_SUCCESS) {
      pcVar1 = this->API_NAME;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,": Failed to set exposure compensation parameter.\n",0x31);
    }
    local_40.id = 0x10007;
    local_40.size = 0x14;
    local_38 = 0x8000000000;
    local_30 = 0x80;
    MVar2 = mmal_port_parameter_set(this->camera->control,&local_40);
    if (MVar2 != MMAL_SUCCESS) {
      pcVar1 = this->API_NAME;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,": Failed to set color effects parameter.\n",0x29);
    }
    local_28.id = 0x10025;
    local_28.size = 0x18;
    local_20 = 0;
    uStack_18 = 0x1000000010000;
    MVar2 = mmal_port_parameter_set(this->camera->control,&local_28);
    if (MVar2 != MMAL_SUCCESS) {
      pcVar1 = this->API_NAME;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,": Failed to set ROI parameter.\n",0x1f);
    }
    port = this->encoder_output_port;
    if (port != (MMAL_PORT_T *)0x0) {
      MVar4 = 0xffffffff;
      if ((ulong)this->encoding < 5) {
        MVar4 = *(MMAL_FOURCC_T *)(&DAT_0010dbbc + (ulong)this->encoding * 4);
      }
      port->format->encoding = MVar4;
      mmal_port_format_commit(port);
    }
    this->changedSettings = false;
  }
  return;
}

Assistant:

void Private_Impl_Still::commitParameters() {
            if ( !changedSettings ) return;
            commitSharpness();
            commitContrast();
            commitBrightness();
            commitQuality();
            commitSaturation();
            commitISO();
            commitExposure();
            commitMetering();
            commitAWB();
            commitImageEffect();
            commitRotation();
            commitFlips();
            // Set Video Stabilization
            if ( mmal_port_parameter_set_boolean ( camera->control, MMAL_PARAMETER_VIDEO_STABILISATION, 0 ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set video stabilization parameter.\n";
            // Set Exposure Compensation
            if ( mmal_port_parameter_set_int32 ( camera->control, MMAL_PARAMETER_EXPOSURE_COMP , 0 ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set exposure compensation parameter.\n";
            // Set Color Efects
            MMAL_PARAMETER_COLOURFX_T colfx = {{MMAL_PARAMETER_COLOUR_EFFECT,sizeof ( colfx ) }, 0, 0, 0};
            colfx.enable = 0;
            colfx.u = 128;
            colfx.v = 128;
            if ( mmal_port_parameter_set ( camera->control, &colfx.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set color effects parameter.\n";
            // Set ROI
            MMAL_PARAMETER_INPUT_CROP_T crop = {{MMAL_PARAMETER_INPUT_CROP, sizeof ( MMAL_PARAMETER_INPUT_CROP_T ) }};
            crop.rect.x = ( 65536 * 0 );
            crop.rect.y = ( 65536 * 0 );
            crop.rect.width = ( 65536 * 1 );
            crop.rect.height = ( 65536 * 1 );
            if ( mmal_port_parameter_set ( camera->control, &crop.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set ROI parameter.\n";
            // Set encoder encoding
            if ( encoder_output_port != NULL ) {
                encoder_output_port->format->encoding = convertEncoding ( encoding );
                mmal_port_format_commit ( encoder_output_port );
            }
            changedSettings = false;
        }